

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_type_info.hpp
# Opt level: O2

void __thiscall
duckdb::EnumTypeInfoTemplated<unsigned_char>::EnumTypeInfoTemplated
          (EnumTypeInfoTemplated<unsigned_char> *this,Vector *values_insert_order_p,idx_t size_p)

{
  size_type sVar1;
  mapped_type *pmVar2;
  InvalidInputException *this_00;
  InternalException *this_01;
  idx_t iVar3;
  idx_t iVar4;
  key_type *__k;
  allocator local_b9;
  string local_b8;
  UnifiedVectorFormat vdata;
  string local_50;
  
  EnumTypeInfo::EnumTypeInfo(&this->super_EnumTypeInfo,values_insert_order_p,size_p);
  (this->super_EnumTypeInfo).super_ExtraTypeInfo._vptr_ExtraTypeInfo =
       (_func_int **)&PTR__EnumTypeInfoTemplated_0177cc88;
  (this->values)._M_h._M_buckets = &(this->values)._M_h._M_single_bucket;
  (this->values)._M_h._M_bucket_count = 1;
  (this->values)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->values)._M_h._M_element_count = 0;
  (this->values)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->values)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->values)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
  Vector::ToUnifiedFormat(&(this->super_EnumTypeInfo).values_insert_order,size_p,&vdata);
  iVar3 = 0;
  while( true ) {
    if (size_p == iVar3) {
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
      return;
    }
    iVar4 = iVar3;
    if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)(vdata.sel)->sel_vector[iVar3];
    }
    if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
         (unsigned_long *)0x0) &&
       ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar4 >> 6] >>
         (iVar4 & 0x3f) & 1) == 0)) break;
    __k = (key_type *)(vdata.data + iVar4 * 0x10);
    sVar1 = std::
            _Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_char>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_char>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::count(&(this->values)._M_h,__k);
    if (sVar1 != 0) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_b8,"Attempted to create ENUM type with duplicate value %s",
                 &local_b9);
      string_t::GetString_abi_cxx11_(&local_50,__k);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (this_00,&local_b8,&local_50);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pmVar2 = std::__detail::
             _Map_base<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_char>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_char>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_char>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_char>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->values,__k);
    *pmVar2 = (mapped_type)iVar3;
    iVar3 = iVar3 + 1;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_b8,"Attempted to create ENUM type with NULL value",&local_b9);
  InternalException::InternalException(this_01,&local_b8);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

explicit EnumTypeInfoTemplated(Vector &values_insert_order_p, idx_t size_p)
	    : EnumTypeInfo(values_insert_order_p, size_p) {
		D_ASSERT(values_insert_order_p.GetType().InternalType() == PhysicalType::VARCHAR);

		UnifiedVectorFormat vdata;
		values_insert_order.ToUnifiedFormat(size_p, vdata);

		auto data = UnifiedVectorFormat::GetData<string_t>(vdata);
		for (idx_t i = 0; i < size_p; i++) {
			auto idx = vdata.sel->get_index(i);
			if (!vdata.validity.RowIsValid(idx)) {
				throw InternalException("Attempted to create ENUM type with NULL value");
			}
			if (values.count(data[idx]) > 0) {
				throw InvalidInputException("Attempted to create ENUM type with duplicate value %s",
				                            data[idx].GetString());
			}
			values[data[idx]] = UnsafeNumericCast<T>(i);
		}
	}